

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

void __thiscall
ot::commissioner::JoinerInfo::JoinerInfo
          (JoinerInfo *this,JoinerType aType,uint64_t aEui64,string *aPSKd,string *aProvisioningUrl)

{
  pointer pcVar1;
  
  this->mType = aType;
  this->mEui64 = aEui64;
  (this->mPSKd)._M_dataplus._M_p = (pointer)&(this->mPSKd).field_2;
  pcVar1 = (aPSKd->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mPSKd,pcVar1,pcVar1 + aPSKd->_M_string_length);
  (this->mProvisioningUrl)._M_dataplus._M_p = (pointer)&(this->mProvisioningUrl).field_2;
  pcVar1 = (aProvisioningUrl->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mProvisioningUrl,pcVar1,pcVar1 + aProvisioningUrl->_M_string_length);
  return;
}

Assistant:

JoinerInfo::JoinerInfo(JoinerType aType, uint64_t aEui64, const std::string &aPSKd, const std::string &aProvisioningUrl)
    : mType(aType)
    , mEui64(aEui64)
    , mPSKd(aPSKd)
    , mProvisioningUrl(aProvisioningUrl)
{
}